

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleUVCols64_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x32,int dx)

{
  long lVar1;
  int iVar2;
  
  lVar1 = (long)x32;
  if (1 < dst_width) {
    iVar2 = 0;
    do {
      *(undefined2 *)dst_uv = *(undefined2 *)(src_uv + (lVar1 >> 0x10) * 2);
      lVar1 = lVar1 + dx;
      *(undefined2 *)(dst_uv + 2) = *(undefined2 *)(src_uv + (lVar1 >> 0x10) * 2);
      lVar1 = lVar1 + dx;
      dst_uv = dst_uv + 4;
      iVar2 = iVar2 + 2;
    } while (iVar2 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *(undefined2 *)dst_uv = *(undefined2 *)(src_uv + (lVar1 >> 0x10) * 2);
  }
  return;
}

Assistant:

void ScaleUVCols64_C(uint8_t* dst_uv,
                     const uint8_t* src_uv,
                     int dst_width,
                     int x32,
                     int dx) {
  int64_t x = (int64_t)(x32);
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[0] = src[x >> 16];
    x += dx;
    dst[1] = src[x >> 16];
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[x >> 16];
  }
}